

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# belt_che.c
# Opt level: O1

void beltCHEStepA(void *buf,size_t count,void *state)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  void *dest;
  
  if (((count != 0) && (*(long *)((long)state + 0x68) == 0)) &&
     (lVar1 = *(long *)((long)state + 0x90), lVar1 != 0)) {
    memSet((void *)((long)state + lVar1 + 0x70),'\0',0x10 - lVar1);
    *(uint *)((long)state + 0x40) = *(uint *)((long)state + 0x70) ^ *(uint *)((long)state + 0x40);
    *(uint *)((long)state + 0x44) = *(uint *)((long)state + 0x74) ^ *(uint *)((long)state + 0x44);
    *(uint *)((long)state + 0x48) = *(uint *)((long)state + 0x78) ^ *(uint *)((long)state + 0x48);
    *(uint *)((long)state + 0x4c) = *(uint *)((long)state + 0x7c) ^ *(uint *)((long)state + 0x4c);
    beltPolyMul((word *)((long)state + 0x40),(word *)((long)state + 0x40),
                (word *)((long)state + 0x30),(void *)((long)state + 0xa0));
    *(undefined8 *)((long)state + 0x90) = 0;
  }
  beltHalfBlockAddBitSizeW((word *)((long)state + 0x68),count);
  lVar1 = *(long *)((long)state + 0x90);
  if (lVar1 != 0) {
    dest = (void *)((long)state + lVar1 + 0x70);
    if (count < 0x10U - lVar1) {
      memCopy(dest,buf,count);
      *(long *)((long)state + 0x90) = *(long *)((long)state + 0x90) + count;
      return;
    }
    memCopy(dest,buf,0x10U - lVar1);
    count = (count + *(long *)((long)state + 0x90)) - 0x10;
    buf = (void *)((long)buf + (0x10 - *(long *)((long)state + 0x90)));
    *(uint *)((long)state + 0x40) = *(uint *)((long)state + 0x70) ^ *(uint *)((long)state + 0x40);
    *(uint *)((long)state + 0x44) = *(uint *)((long)state + 0x74) ^ *(uint *)((long)state + 0x44);
    *(uint *)((long)state + 0x48) = *(uint *)((long)state + 0x78) ^ *(uint *)((long)state + 0x48);
    *(uint *)((long)state + 0x4c) = *(uint *)((long)state + 0x7c) ^ *(uint *)((long)state + 0x4c);
    beltPolyMul((word *)((long)state + 0x40),(word *)((long)state + 0x40),
                (word *)((long)state + 0x30),(void *)((long)state + 0xa0));
    *(undefined8 *)((long)state + 0x90) = 0;
  }
  if (0xf < count) {
    do {
      uVar2 = *buf;
      *(ulong *)((long)state + 0x70) = uVar2;
      uVar3 = *(ulong *)((long)buf + 8);
      *(ulong *)((long)state + 0x78) = uVar3;
      *(ulong *)((long)state + 0x40) = *(ulong *)((long)state + 0x40) ^ uVar2;
      *(ulong *)((long)state + 0x48) = *(ulong *)((long)state + 0x48) ^ uVar3;
      beltPolyMul((word *)((long)state + 0x40),(word *)((long)state + 0x40),
                  (word *)((long)state + 0x30),(void *)((long)state + 0xa0));
      buf = (void *)((long)buf + 0x10);
      count = count - 0x10;
    } while (0xf < count);
  }
  if (count == 0) {
    return;
  }
  *(size_t *)((long)state + 0x90) = count;
  memCopy((void *)((long)state + 0x70),buf,count);
  return;
}

Assistant:

void beltCHEStepA(const void* buf, size_t count, void* state)
{
	belt_che_st* st = (belt_che_st*)state;
	ASSERT(memIsDisjoint2(buf, count, state, beltCHE_keep()));
	// первый непустой фрагмент критических данных?
	// есть необработанные открытые данные?
	if (count && beltHalfBlockIsZero(st->len + W_OF_B(64)) && st->filled)
	{
		memSetZero(st->block + st->filled, 16 - st->filled);
#if (OCTET_ORDER == BIG_ENDIAN)
		beltBlockRevW(st->block);
#endif
		beltBlockXor2(st->t, st->block);
		beltPolyMul(st->t, st->t, st->r, st->stack);
		st->filled = 0;
	}
	// обновить длину
	beltHalfBlockAddBitSizeW(st->len + W_OF_B(64), count);
	// есть накопленные данные?
	if (st->filled)
	{
		if (count < 16 - st->filled)
		{
			memCopy(st->block + st->filled, buf, count);
			st->filled += count;
			return;
		}
		memCopy(st->block + st->filled, buf, 16 - st->filled);
		count -= 16 - st->filled;
		buf = (const octet*)buf + 16 - st->filled;
#if (OCTET_ORDER == BIG_ENDIAN)
		beltBlockRevW(st->block);
#endif
		beltBlockXor2(st->t, st->block);
		beltPolyMul(st->t, st->t, st->r, st->stack);
		st->filled = 0;
	}
	// цикл по полным блокам
	while (count >= 16)
	{
		beltBlockCopy(st->block, buf);
#if (OCTET_ORDER == BIG_ENDIAN)
		beltBlockRevW(st->block);
#endif
		beltBlockXor2(st->t, st->block);
		beltPolyMul(st->t, st->t, st->r, st->stack);
		buf = (const octet*)buf + 16;
		count -= 16;
	}
	// неполный блок?
	if (count)
		memCopy(st->block, buf, st->filled = count);
}